

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_color_sinks-inl.h
# Opt level: O3

shared_ptr<spdlog::logger> __thiscall
spdlog::stderr_color_st<spdlog::async_factory_impl<(spdlog::async_overflow_policy)0>>
          (spdlog *this,string *logger_name,color_mode mode)

{
  pointer pcVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<spdlog::async_logger> sVar4;
  shared_ptr<spdlog::logger> sVar5;
  undefined8 local_58;
  undefined8 uStack_50;
  color_mode local_44;
  string local_40;
  
  pcVar1 = (logger_name->_M_dataplus)._M_p;
  local_44 = mode;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + logger_name->_M_string_length);
  sVar4 = async_factory_impl<(spdlog::async_overflow_policy)0>::
          create<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>,spdlog::color_mode&>
                    ((async_factory_impl<(spdlog::async_overflow_policy)0> *)&local_58,&local_40,
                     &local_44);
  uVar2 = uStack_50;
  _Var3 = sVar4.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  uStack_50 = 0;
  *(undefined8 *)this = local_58;
  *(undefined8 *)(this + 8) = uVar2;
  local_58 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    _Var3._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar5.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar5.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<logger> stderr_color_st(const std::string &logger_name, color_mode mode)
{
    return Factory::template create<sinks::stderr_color_sink_st>(logger_name, mode);
}